

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

uint64_t __thiscall
fmt::v10::detail::dragonbox::cache_accessor<float>::get_cached_power
          (cache_accessor<float> *this,int k)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  compute_mul_parity_result cVar12;
  cache_entry_type *cache;
  uint64_t extraout_RAX;
  byte bVar13;
  uint uVar14;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar15;
  char cVar16;
  int iVar17;
  undefined4 in_register_00000034;
  long *plVar18;
  ulong *puVar19;
  uint uVar20;
  ulong uVar22;
  ulong uVar23;
  char *pcVar24;
  ulong uVar25;
  ulong uVar26;
  uint64_t uVar27;
  ulong extraout_XMM0_Qa;
  uint128_fallback uVar28;
  uint128_fallback uStack_60;
  uint uStack_4c;
  uint *puVar21;
  
  plVar18 = (long *)CONCAT44(in_register_00000034,k);
  uVar20 = (int)this + 0x1f;
  puVar21 = (uint *)(ulong)uVar20;
  if (uVar20 < 0x4e) {
    return get_cached_power::pow10_significands[uVar20];
  }
  get_cached_power();
  if (extraout_EDX < 1) {
    compute_mul_parity();
  }
  else if (extraout_EDX < 0x40) {
    uVar22 = ((ulong)puVar21 & 0xffffffff) * *plVar18;
    return (ulong)CONCAT11((int)(uVar22 >> (-((char)extraout_EDX + ' ') & 0x3fU)) == 0,
                           (uVar22 >> ((ulong)(byte)(0x40 - (char)extraout_EDX) & 0x3f) & 1) != 0);
  }
  iVar17 = (int)plVar18;
  compute_mul_parity();
  if (*puVar21 < 0x65) {
    uVar14 = *puVar21 * 0x199a;
    uVar20 = uVar14 & 0xffff;
    *puVar21 = uVar14 >> 0x10;
    return (ulong)CONCAT31((int3)(uVar20 >> 8),uVar20 < 0x199a);
  }
  check_divisibility_and_divide_by_pow10<1>();
  uVar22 = extraout_XMM0_Qa & 0xfffffffffffff;
  uVar20 = (uint)(extraout_XMM0_Qa >> 0x34) & 0x7ff;
  if (uVar20 == 0) {
    uVar20 = 0xfffffbce;
    if (uVar22 == 0) {
      return 0;
    }
LAB_0019009d:
    uVar14 = 2 - ((int)(uVar20 * 0x4d105) >> 0x14);
    uStack_60 = cache_accessor<double>::get_cached_power
                          ((cache_accessor<double> *)(ulong)uVar14,iVar17);
    cache = (cache_entry_type *)uStack_60.lo_;
    iVar17 = ((int)(uVar14 * 0x1a934f) >> 0x13) + uVar20;
    uVar25 = uVar22 * 2 + 1 << ((byte)iVar17 & 0x3f);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uStack_60.hi_;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar25;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = cache;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar25;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = SUB168(auVar2 * auVar8,8);
    auVar10 = auVar1 * auVar7 + auVar10;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = auVar10._8_8_;
    uVar25 = SUB168(auVar3 * ZEXT816(0x20c49ba5e353f7cf),8) >> 7;
    uVar14 = auVar10._8_4_ + (int)uVar25 * -1000;
    uVar20 = (uint)(uStack_60.hi_ >> (~(byte)iVar17 & 0x3f));
    if (uVar14 < uVar20) {
      if (((uVar14 == 0) && (auVar10._0_8_ == 0)) && ((uVar22 & 1) != 0)) {
        uVar25 = uVar25 - 1;
        uVar14 = 1000;
        goto LAB_001901e7;
      }
    }
    else {
      if (uVar20 < uVar14) {
LAB_001901e7:
        uVar14 = uVar14 - (uVar20 >> 1);
        uStack_4c = uVar14 + 0x32;
        bVar11 = check_divisibility_and_divide_by_pow10<2>
                           ((dragonbox *)&uStack_4c,(uint32_t *)cache);
        uVar20 = uStack_4c;
        uVar27 = (ulong)uStack_4c + uVar25 * 10;
        if (bVar11) {
          cVar12 = cache_accessor<double>::compute_mul_parity(uVar22 * 2,&uStack_60,iVar17);
          if ((uVar14 & 1) == ((ushort)cVar12 & 1)) {
            uVar27 = uVar27 + (long)(int)-((ushort)cVar12 >> 8 & uVar20 & 1);
          }
          else {
            uVar27 = uVar27 - 1;
          }
        }
        return uVar27;
      }
      cache = &uStack_60;
      cVar12 = cache_accessor<double>::compute_mul_parity(uVar22 * 2 - 1,cache,iVar17);
      if ((~(uint)uVar22 & (uint)((ushort)cVar12 >> 8) & 1) == 0 && ((ushort)cVar12 & 1) == 0)
      goto LAB_001901e7;
    }
    if (uVar25 == 0) {
      to_decimal<double>();
    }
    else {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar25;
      if (0xabcc77118461cefc < SUB168(auVar4 * ZEXT816(0xabcc77118461cefd),0) ||
          (auVar4 * ZEXT816(0xabcc77118461cefd) & (undefined1  [16])0x3ffffff) !=
          (undefined1  [16])0x0) {
        do {
          uVar27 = uVar25;
          uVar25 = uVar27 * -0x70a3d70a3d70a3d7 >> 2 | uVar27 << 0x3e;
        } while (uVar25 < 0x28f5c28f5c28f5d);
        uVar22 = uVar27 * -0x3333333333333333 >> 1 | uVar27 << 0x3f;
        if (uVar22 < 0x199999999999999a) {
          return uVar22;
        }
        return uVar27;
      }
      uVar25 = uVar25 / 100000000;
      if (uVar25 != 0) {
        do {
          uVar20 = (int)uVar25 * 0x40000000 | (uint)((int)uVar25 * -0x3d70a3d7) >> 2;
          uVar22 = (ulong)uVar20;
          if (0x28f5c28 < uVar20) {
            uVar22 = uVar25;
          }
          uVar14 = (uint)uVar22;
          uVar25 = uVar22;
        } while (0x28f5c28 >= uVar20);
LAB_001903bd:
        uVar20 = uVar14 * -0x33333333 >> 1 | (uint)((uVar14 * -0x33333333 & 1) != 0) << 0x1f;
        if (0x19999999 < uVar20) {
          uVar20 = uVar14;
        }
        return (ulong)uVar20;
      }
    }
    to_decimal<double>();
  }
  else {
    uVar20 = uVar20 - 0x433;
    if (uVar22 != 0) {
      uVar22 = uVar22 + 0x10000000000000;
      goto LAB_0019009d;
    }
    iVar15 = (int)(uVar20 * 0x9a209 + -0x3fe1f) >> 0x15;
    cVar16 = (char)(iVar15 * -0x1a934f >> 0x13) + (char)uVar20;
    uVar28 = cache_accessor<double>::get_cached_power
                       ((cache_accessor<double> *)(ulong)(uint)-iVar15,iVar17);
    uVar25 = uVar28.hi_;
    bVar13 = 0xb - cVar16;
    uVar23 = (uVar25 >> 0x35) + uVar25 >> (bVar13 & 0x3f);
    uVar26 = (ulong)((uVar20 & 0xfffffffe) != 2) + (uVar25 - (uVar25 >> 0x36) >> (bVar13 & 0x3f));
    uVar22 = uVar23 / 10;
    if (uVar22 * 10 < uVar26) {
      uVar22 = (uVar25 >> (10U - cVar16 & 0x3f)) + 1 >> 1;
      if (uVar20 == 0xffffffb3) {
        return uVar22 & 0xfffffffffffffffe;
      }
      return uVar22 + (uVar22 < uVar26);
    }
    if (9 < uVar23) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar22;
      if (0xabcc77118461cefc < SUB168(auVar5 * ZEXT816(0xabcc77118461cefd),0) ||
          (auVar5 * ZEXT816(0xabcc77118461cefd) & (undefined1  [16])0x3ffffff) !=
          (undefined1  [16])0x0) {
        do {
          uVar27 = uVar22;
          uVar22 = uVar27 * -0x70a3d70a3d70a3d7 >> 2 | uVar27 << 0x3e;
        } while (uVar22 < 0x28f5c28f5c28f5d);
        uVar22 = uVar27 * -0x3333333333333333 >> 1 | uVar27 << 0x3f;
        if (uVar22 < 0x199999999999999a) {
          return uVar22;
        }
        return uVar27;
      }
      uVar22 = uVar22 / 100000000;
      if ((int)uVar22 != 0) {
        do {
          uVar25 = uVar22 & 0xffffffff;
          uVar20 = (int)uVar22 * 0x40000000 | (uint)((int)uVar22 * -0x3d70a3d7) >> 2;
          uVar22 = (ulong)uVar20;
          if (0x28f5c28 < uVar20) {
            uVar22 = uVar25;
          }
          uVar14 = (uint)uVar22;
        } while (0x28f5c28 >= uVar20);
        goto LAB_001903bd;
      }
      goto LAB_00190468;
    }
  }
  to_decimal<double>();
LAB_00190468:
  pcVar24 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/format-inl.h"
  ;
  puVar19 = (ulong *)0x472;
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/format-inl.h"
              ,0x472,"");
  if (extraout_EDX_00 < 1) {
    cache_accessor<double>::compute_mul_parity();
  }
  else if (extraout_EDX_00 < 0x40) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = pcVar24;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *puVar19;
    uVar22 = SUB168(auVar6 * auVar9,8) + puVar19[1] * (long)pcVar24;
    bVar13 = (byte)extraout_EDX_00 & 0x3f;
    return (ulong)CONCAT11(uVar22 << bVar13 == 0 && SUB168(auVar6 * auVar9,0) >> 0x40 - bVar13 == 0,
                           (uVar22 >> ((ulong)(byte)(0x40 - (byte)extraout_EDX_00) & 0x3f) & 1) != 0
                          );
  }
  cache_accessor<double>::compute_mul_parity();
  if (1000 < *(uint *)pcVar24) {
    check_divisibility_and_divide_by_pow10<2>();
    *(ulong **)pcVar24 = puVar19;
    return extraout_RAX;
  }
  uVar14 = *(uint *)pcVar24 * 0x290;
  uVar20 = uVar14 & 0xffff;
  *(uint *)pcVar24 = uVar14 >> 0x10;
  return (ulong)CONCAT31((int3)(uVar20 >> 8),uVar20 < 0x290);
}

Assistant:

static auto get_cached_power(int k) noexcept -> uint64_t {
    FMT_ASSERT(k >= float_info<float>::min_k && k <= float_info<float>::max_k,
               "k is out of range");
    static constexpr const uint64_t pow10_significands[] = {
        0x81ceb32c4b43fcf5, 0xa2425ff75e14fc32, 0xcad2f7f5359a3b3f,
        0xfd87b5f28300ca0e, 0x9e74d1b791e07e49, 0xc612062576589ddb,
        0xf79687aed3eec552, 0x9abe14cd44753b53, 0xc16d9a0095928a28,
        0xf1c90080baf72cb2, 0x971da05074da7bef, 0xbce5086492111aeb,
        0xec1e4a7db69561a6, 0x9392ee8e921d5d08, 0xb877aa3236a4b44a,
        0xe69594bec44de15c, 0x901d7cf73ab0acda, 0xb424dc35095cd810,
        0xe12e13424bb40e14, 0x8cbccc096f5088cc, 0xafebff0bcb24aaff,
        0xdbe6fecebdedd5bf, 0x89705f4136b4a598, 0xabcc77118461cefd,
        0xd6bf94d5e57a42bd, 0x8637bd05af6c69b6, 0xa7c5ac471b478424,
        0xd1b71758e219652c, 0x83126e978d4fdf3c, 0xa3d70a3d70a3d70b,
        0xcccccccccccccccd, 0x8000000000000000, 0xa000000000000000,
        0xc800000000000000, 0xfa00000000000000, 0x9c40000000000000,
        0xc350000000000000, 0xf424000000000000, 0x9896800000000000,
        0xbebc200000000000, 0xee6b280000000000, 0x9502f90000000000,
        0xba43b74000000000, 0xe8d4a51000000000, 0x9184e72a00000000,
        0xb5e620f480000000, 0xe35fa931a0000000, 0x8e1bc9bf04000000,
        0xb1a2bc2ec5000000, 0xde0b6b3a76400000, 0x8ac7230489e80000,
        0xad78ebc5ac620000, 0xd8d726b7177a8000, 0x878678326eac9000,
        0xa968163f0a57b400, 0xd3c21bcecceda100, 0x84595161401484a0,
        0xa56fa5b99019a5c8, 0xcecb8f27f4200f3a, 0x813f3978f8940985,
        0xa18f07d736b90be6, 0xc9f2c9cd04674edf, 0xfc6f7c4045812297,
        0x9dc5ada82b70b59e, 0xc5371912364ce306, 0xf684df56c3e01bc7,
        0x9a130b963a6c115d, 0xc097ce7bc90715b4, 0xf0bdc21abb48db21,
        0x96769950b50d88f5, 0xbc143fa4e250eb32, 0xeb194f8e1ae525fe,
        0x92efd1b8d0cf37bf, 0xb7abc627050305ae, 0xe596b7b0c643c71a,
        0x8f7e32ce7bea5c70, 0xb35dbf821ae4f38c, 0xe0352f62a19e306f};
    return pow10_significands[k - float_info<float>::min_k];
  }